

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

float __thiscall ON_4fPoint::operator[](ON_4fPoint *this,uint i)

{
  float local_2c;
  float local_28;
  float local_24;
  uint i_local;
  ON_4fPoint *this_local;
  
  if (i == 0) {
    local_24 = this->x;
  }
  else {
    if (i < 3) {
      if (i == 1) {
        local_2c = this->y;
      }
      else {
        local_2c = this->z;
      }
      local_28 = local_2c;
    }
    else {
      local_28 = this->w;
    }
    local_24 = local_28;
  }
  return local_24;
}

Assistant:

float ON_4fPoint::operator[](unsigned int i) const
{
  return ((i<=0)?x:((i>=3)?w:((i==1)?y:z)));
}